

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

double GetDefaultSpeed(PClassActor *type)

{
  int iVar1;
  AActor *pAVar2;
  PClassActor *type_local;
  
  if (type == (PClassActor *)0x0) {
    type_local = (PClassActor *)0x0;
  }
  else {
    iVar1 = G_SkillProperty(SKILLP_FastMonsters);
    if ((iVar1 == 0) || (type->FastSpeed < 0.0)) {
      pAVar2 = GetDefaultByType(&type->super_PClass);
      type_local = (PClassActor *)pAVar2->Speed;
    }
    else {
      type_local = (PClassActor *)type->FastSpeed;
    }
  }
  return (double)type_local;
}

Assistant:

static double GetDefaultSpeed(PClassActor *type)
{
	if (type == NULL)
		return 0;
	else if (G_SkillProperty(SKILLP_FastMonsters) && type->FastSpeed >= 0)
		return type->FastSpeed;
	else
		return GetDefaultByType(type)->Speed;
}